

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O1

void event_signal(game_event_type type)

{
  event_handler_entry *peVar1;
  
  for (peVar1 = event_handlers[type]; peVar1 != (event_handler_entry *)0x0; peVar1 = peVar1->next) {
    (*peVar1->fn)(type,(game_event_data *)0x0,peVar1->user);
  }
  return;
}

Assistant:

static void game_event_dispatch(game_event_type type, game_event_data *data)
{
	struct event_handler_entry *this = event_handlers[type];

	/* 
	 * Send the word out to all interested event handlers.
	 */
	while (this)
	{
		/* Call the handler with the relevant data */
		this->fn(type, data, this->user);
		this = this->next;
	}
}